

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# CImg.h
# Opt level: O1

CImg<unsigned_char> * __thiscall
cimg_library::CImg<unsigned_char>::draw_rectangle
          (CImg<unsigned_char> *this,int x0,int y0,int z0,int c0,int x1,int y1,int z1,int c1,
          uchar val,float opacity)

{
  uint uVar1;
  uint uVar2;
  uint uVar3;
  undefined4 uVar4;
  uint uVar5;
  int iVar6;
  int iVar7;
  int iVar8;
  uint uVar9;
  ulong uVar10;
  long lVar11;
  int iVar12;
  long lVar13;
  uint uVar14;
  uint uVar15;
  uint uVar16;
  int iVar17;
  long lVar18;
  long lVar19;
  int y;
  int iVar20;
  long lVar21;
  uint uVar22;
  byte *__s;
  uint uVar23;
  undefined1 auVar24 [16];
  int local_8c;
  
  if (this->_data != (uchar *)0x0) {
    uVar1 = this->_width;
    uVar2 = this->_height;
    uVar3 = this->_depth;
    auVar24._0_4_ = -(uint)(uVar1 == 0);
    auVar24._4_4_ = -(uint)(uVar2 == 0);
    auVar24._8_4_ = -(uint)(uVar3 == 0);
    auVar24._12_4_ = -(uint)(this->_spectrum == 0);
    uVar4 = movmskps((int)this,auVar24);
    if ((char)uVar4 == '\0') {
      uVar9 = x1;
      if (x0 < x1) {
        uVar9 = x0;
      }
      lVar18 = (long)x1;
      if (x1 < x0) {
        x1 = x0;
      }
      uVar16 = y1;
      if (y0 < y1) {
        uVar16 = y0;
      }
      uVar5 = y1;
      if (y1 < y0) {
        uVar5 = y0;
      }
      uVar15 = z1;
      if (z0 < z1) {
        uVar15 = z0;
      }
      uVar23 = z1;
      if (z1 < z0) {
        uVar23 = z0;
      }
      uVar22 = c1;
      if (c0 < c1) {
        uVar22 = c0;
      }
      uVar14 = c1;
      if (c1 < c0) {
        uVar14 = c0;
      }
      lVar18 = x0 - lVar18;
      lVar19 = -lVar18;
      if (0 < lVar18) {
        lVar19 = lVar18;
      }
      iVar17 = ~x1 + uVar1;
      if (x1 < (int)uVar1) {
        iVar17 = 0;
      }
      lVar13 = (long)y0 - (long)y1;
      lVar18 = -lVar13;
      if (0 < lVar13) {
        lVar18 = lVar13;
      }
      iVar12 = ~uVar5 + uVar2;
      if ((int)uVar5 < (int)uVar2) {
        iVar12 = 0;
      }
      lVar11 = (long)z0 - (long)z1;
      lVar13 = -lVar11;
      if (0 < lVar11) {
        lVar13 = lVar11;
      }
      iVar6 = ~uVar23 + uVar3;
      if ((int)uVar23 < (int)uVar3) {
        iVar6 = 0;
      }
      lVar21 = (long)c0 - (long)c1;
      lVar11 = -lVar21;
      if (0 < lVar21) {
        lVar11 = lVar21;
      }
      uVar5 = iVar17 + 1 + ((int)uVar9 >> 0x1f & uVar9) + (int)lVar19;
      iVar17 = ~uVar14 + this->_spectrum;
      if ((int)uVar14 < (int)this->_spectrum) {
        iVar17 = 0;
      }
      if ((((0 < (int)uVar5) &&
           (iVar12 = iVar12 + ((int)uVar16 >> 0x1f & uVar16) + (int)lVar18 + 1, 0 < iVar12)) &&
          (iVar6 = iVar6 + ((int)uVar15 >> 0x1f & uVar15) + (int)lVar13 + 1, 0 < iVar6)) &&
         (iVar17 = ((int)uVar22 >> 0x1f & uVar22) + (int)lVar11 + iVar17 + 1, 0 < iVar17)) {
        uVar10 = (ulong)uVar9;
        if ((int)uVar9 < 1) {
          uVar10 = 0;
        }
        if ((int)uVar16 < 1) {
          uVar16 = 0;
        }
        iVar7 = uVar2 * uVar1;
        if ((int)uVar15 < 1) {
          uVar15 = 0;
        }
        local_8c = 0;
        if ((int)uVar22 < 1) {
          uVar22 = 0;
        }
        __s = this->_data +
              (ulong)(uVar22 * uVar3 * iVar7) + (ulong)(uVar15 * iVar7) + uVar16 * uVar1 + uVar10;
        do {
          iVar8 = 0;
          do {
            iVar20 = 0;
            do {
              uVar9 = uVar5;
              if (1.0 <= opacity) {
                memset(__s,(uint)val,(ulong)uVar5);
                __s = __s + this->_width;
              }
              else {
                do {
                  *__s = (byte)(int)((float)*__s *
                                     (1.0 - (float)(-(uint)(0.0 <= opacity) & (uint)opacity)) +
                                    (float)val * ABS(opacity));
                  __s = __s + 1;
                  uVar9 = uVar9 - 1;
                } while (uVar9 != 0);
                __s = __s + (uVar1 - uVar5);
              }
              iVar20 = iVar20 + 1;
            } while (iVar20 != iVar12);
            __s = __s + (uVar2 - iVar12) * uVar1;
            iVar8 = iVar8 + 1;
          } while (iVar8 != iVar6);
          __s = __s + (uVar3 - iVar6) * iVar7;
          local_8c = local_8c + 1;
        } while (local_8c != iVar17);
      }
    }
  }
  return this;
}

Assistant:

CImg<T>& draw_rectangle(const int x0, const int y0, const int z0, const int c0,
                            const int x1, const int y1, const int z1, const int c1,
                            const T val, const float opacity=1) {
      if (is_empty()) return *this;
      const bool bx = (x0<x1), by = (y0<y1), bz = (z0<z1), bc = (c0<c1);
      const int
        nx0 = bx?x0:x1, nx1 = bx?x1:x0,
        ny0 = by?y0:y1, ny1 = by?y1:y0,
        nz0 = bz?z0:z1, nz1 = bz?z1:z0,
        nc0 = bc?c0:c1, nc1 = bc?c1:c0;
      const int
        lX = (1 + nx1 - nx0) + (nx1>=width()?width() - 1 - nx1:0) + (nx0<0?nx0:0),
        lY = (1 + ny1 - ny0) + (ny1>=height()?height() - 1 - ny1:0) + (ny0<0?ny0:0),
        lZ = (1 + nz1 - nz0) + (nz1>=depth()?depth() - 1 - nz1:0) + (nz0<0?nz0:0),
        lC = (1 + nc1 - nc0) + (nc1>=spectrum()?spectrum() - 1 - nc1:0) + (nc0<0?nc0:0);
      const unsigned int offX = _width - lX, offY = _width*(_height - lY), offZ = _width*_height*(_depth - lZ);
      const float nopacity = cimg::abs(opacity), copacity = 1 - cimg::max(opacity,0);
      T *ptrd = data(nx0<0?0:nx0,ny0<0?0:ny0,nz0<0?0:nz0,nc0<0?0:nc0);
      if (lX>0 && lY>0 && lZ>0 && lC>0)
        for (int v = 0; v<lC; ++v) {
          for (int z = 0; z<lZ; ++z) {
            for (int y = 0; y<lY; ++y) {
              if (opacity>=1) {
                if (sizeof(T)!=1) { for (int x = 0; x<lX; ++x) *(ptrd++) = val; ptrd+=offX; }
                else { std::memset(ptrd,(int)val,lX); ptrd+=_width; }
              } else { for (int x = 0; x<lX; ++x) { *ptrd = (T)(nopacity*val + *ptrd*copacity); ++ptrd; } ptrd+=offX; }
            }
            ptrd+=offY;
          }
          ptrd+=offZ;
        }
      return *this;
    }